

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

void __thiscall CoreML::Model::toStringStream(Model *this,stringstream *ss)

{
  int iVar1;
  Rep *pRVar2;
  bool bVar3;
  ostream *poVar4;
  char *pcVar5;
  ModelDescription *pMVar6;
  ostream *poVar7;
  long lVar8;
  void **ppvVar9;
  
  poVar7 = (ostream *)(ss + 0x10);
  poVar4 = std::operator<<(poVar7,"Spec version: ");
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar4,
                      ((this->m_spec).
                       super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->specificationversion_);
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar7,"Model type: ");
  pcVar5 = MLModelType_Name(((this->m_spec).
                             super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->_oneof_case_[0]);
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar7,"Interface:");
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar7,"\t");
  poVar4 = std::operator<<(poVar4,"Inputs:");
  std::operator<<(poVar4,"\n");
  pMVar6 = ((this->m_spec).
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           description_;
  if (pMVar6 == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  pRVar2 = (pMVar6->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar9 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar9 = (void **)0x0;
  }
  iVar1 = (pMVar6->input_).super_RepeatedPtrFieldBase.current_size_;
  for (lVar8 = 0; (long)iVar1 * 8 != lVar8; lVar8 = lVar8 + 8) {
    writeFeatureDescription(ss,*(FeatureDescription **)((long)ppvVar9 + lVar8));
  }
  poVar4 = std::operator<<(poVar7,"\t");
  poVar4 = std::operator<<(poVar4,"Outputs:");
  std::operator<<(poVar4,"\n");
  pMVar6 = ((this->m_spec).
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           description_;
  if (pMVar6 == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  pRVar2 = (pMVar6->output_).super_RepeatedPtrFieldBase.rep_;
  ppvVar9 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar9 = (void **)0x0;
  }
  iVar1 = (pMVar6->output_).super_RepeatedPtrFieldBase.current_size_;
  for (lVar8 = 0; (long)iVar1 * 8 != lVar8; lVar8 = lVar8 + 8) {
    writeFeatureDescription(ss,*(FeatureDescription **)((long)ppvVar9 + lVar8));
  }
  pMVar6 = ((this->m_spec).
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           description_;
  if (pMVar6 == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  bVar3 = std::operator!=((pMVar6->predictedfeaturename_).ptr_,"");
  if (bVar3) {
    poVar4 = std::operator<<(poVar7,"\t");
    poVar4 = std::operator<<(poVar4,"Predicted feature name: ");
    pMVar6 = ((this->m_spec).
              super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             description_;
    if (pMVar6 == (ModelDescription *)0x0) {
      pMVar6 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
    }
    poVar4 = std::operator<<(poVar4,(string *)(pMVar6->predictedfeaturename_).ptr_);
    std::operator<<(poVar4,"\n");
  }
  pMVar6 = ((this->m_spec).
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           description_;
  if (pMVar6 == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  bVar3 = std::operator!=((pMVar6->predictedprobabilitiesname_).ptr_,"");
  if (bVar3) {
    poVar7 = std::operator<<(poVar7,"\t");
    poVar7 = std::operator<<(poVar7,"Predicted probability name: ");
    pMVar6 = ((this->m_spec).
              super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             description_;
    if (pMVar6 == (ModelDescription *)0x0) {
      pMVar6 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
    }
    poVar7 = std::operator<<(poVar7,(string *)(pMVar6->predictedprobabilitiesname_).ptr_);
    std::operator<<(poVar7,"\n");
    return;
  }
  return;
}

Assistant:

void Model::toStringStream(std::stringstream& ss) const {
        ss << "Spec version: " << m_spec->specificationversion() << "\n";
        ss << "Model type: " << MLModelType_Name(static_cast<MLModelType>(m_spec->Type_case())) << "\n";
        ss << "Interface:" << "\n";
        ss << "\t" << "Inputs:" << "\n";
        for (const auto& input : m_spec->description().input()) {
            writeFeatureDescription(ss, input);
        }
        ss << "\t" << "Outputs:" << "\n";
        for (const auto& output : m_spec->description().output()) {
            writeFeatureDescription(ss, output);
        }
        if (m_spec->description().predictedfeaturename() != "") {
            ss << "\t" << "Predicted feature name: " << m_spec->description().predictedfeaturename() << "\n";
        }
        if (m_spec->description().predictedprobabilitiesname() != "") {
            ss << "\t" << "Predicted probability name: " << m_spec->description().predictedprobabilitiesname() << "\n";
        }
    }